

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem2der.c
# Opt level: O0

int convert_pem_to_der(uchar *input,size_t ilen,uchar *output,size_t *olen)

{
  bool bVar1;
  size_t local_58;
  size_t len;
  uchar *end;
  uchar *s2;
  uchar *s1;
  size_t *psStack_30;
  int ret;
  size_t *olen_local;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  len = (size_t)(input + ilen);
  local_58 = 0;
  psStack_30 = olen;
  olen_local = (size_t *)output;
  output_local = (uchar *)ilen;
  ilen_local = (size_t)input;
  s2 = (uchar *)strstr((char *)input,"-----BEGIN");
  if (s2 == (uchar *)0x0) {
    input_local._4_4_ = -1;
  }
  else {
    end = (uchar *)strstr((char *)ilen_local,"-----END");
    if (end == (uchar *)0x0) {
      input_local._4_4_ = -1;
    }
    else {
      s2 = s2 + 10;
      while( true ) {
        bVar1 = false;
        if (s2 < len) {
          bVar1 = *s2 != '-';
        }
        if (!bVar1) break;
        s2 = s2 + 1;
      }
      while( true ) {
        bVar1 = false;
        if (s2 < len) {
          bVar1 = *s2 == '-';
        }
        if (!bVar1) break;
        s2 = s2 + 1;
      }
      if (*s2 == '\r') {
        s2 = s2 + 1;
      }
      if (*s2 == '\n') {
        s2 = s2 + 1;
      }
      if ((s2 < end) && (end <= len)) {
        s1._4_4_ = mbedtls_base64_decode((uchar *)0x0,0,&local_58,s2,(long)end - (long)s2);
        if (s1._4_4_ == -0x2c) {
          input_local._4_4_ = -0x2c;
        }
        else if (*psStack_30 < local_58) {
          input_local._4_4_ = -1;
        }
        else {
          input_local._4_4_ =
               mbedtls_base64_decode((uchar *)olen_local,local_58,&local_58,s2,(long)end - (long)s2)
          ;
          if (input_local._4_4_ == 0) {
            *psStack_30 = local_58;
            input_local._4_4_ = 0;
          }
        }
      }
      else {
        input_local._4_4_ = -1;
      }
    }
  }
  return input_local._4_4_;
}

Assistant:

int convert_pem_to_der( const unsigned char *input, size_t ilen,
                        unsigned char *output, size_t *olen )
{
    int ret;
    const unsigned char *s1, *s2, *end = input + ilen;
    size_t len = 0;

    s1 = (unsigned char *) strstr( (const char *) input, "-----BEGIN" );
    if( s1 == NULL )
        return( -1 );

    s2 = (unsigned char *) strstr( (const char *) input, "-----END" );
    if( s2 == NULL )
        return( -1 );

    s1 += 10;
    while( s1 < end && *s1 != '-' )
        s1++;
    while( s1 < end && *s1 == '-' )
        s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;

    if( s2 <= s1 || s2 > end )
        return( -1 );

    ret = mbedtls_base64_decode( NULL, 0, &len, (const unsigned char *) s1, s2 - s1 );
    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( ret );

    if( len > *olen )
        return( -1 );

    if( ( ret = mbedtls_base64_decode( output, len, &len, (const unsigned char *) s1,
                               s2 - s1 ) ) != 0 )
    {
        return( ret );
    }

    *olen = len;

    return( 0 );
}